

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlFAParseQuantExact(xmlRegParserCtxtPtr ctxt)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  
  bVar4 = true;
  iVar6 = 0;
  bVar3 = false;
  pbVar2 = ctxt->cur;
  while( true ) {
    bVar1 = *pbVar2;
    if (9 < (byte)(bVar1 - 0x30)) break;
    if (iVar6 < 0xccccccd) {
      iVar5 = bVar1 - 0x30;
      if ((int)(-0x7fffffd1 - (uint)bVar1) < iVar6 * 10) {
        iVar5 = 0;
        bVar3 = true;
      }
      iVar6 = iVar5 + iVar6 * 10;
    }
    else {
      bVar3 = true;
    }
    ctxt->cur = pbVar2 + 1;
    bVar4 = false;
    pbVar2 = pbVar2 + 1;
  }
  if (bVar3) {
    iVar6 = -1;
  }
  if (bVar4) {
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

static int
xmlFAParseQuantExact(xmlRegParserCtxtPtr ctxt) {
    int ret = 0;
    int ok = 0;
    int overflow = 0;

    while ((CUR >= '0') && (CUR <= '9')) {
        if (ret > INT_MAX / 10) {
            overflow = 1;
        } else {
            int digit = CUR - '0';

            ret *= 10;
            if (ret > INT_MAX - digit)
                overflow = 1;
            else
                ret += digit;
        }
	ok = 1;
	NEXT;
    }
    if ((ok != 1) || (overflow == 1)) {
	return(-1);
    }
    return(ret);
}